

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O0

VP8StatusCode
ParseOptionalChunks(uint8_t **data,size_t *data_size,size_t riff_size,uint8_t **alpha_data,
                   size_t *alpha_size)

{
  uint32_t uVar1;
  undefined8 *in_RCX;
  ulong in_RDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  ulong *in_R8;
  uint32_t disk_chunk_size;
  uint32_t chunk_size;
  uint32_t total_size;
  size_t buf_size;
  uint8_t *buf;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint local_44;
  ulong local_40;
  int *local_38;
  
  local_44 = 0x16;
  local_38 = (int *)*in_RDI;
  local_40 = *in_RSI;
  *in_RCX = 0;
  *in_R8 = 0;
  while( true ) {
    *in_RDI = local_38;
    *in_RSI = local_40;
    if (local_40 < 8) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    uVar1 = GetLE32((uint8_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    if (0xfffffff6 < uVar1) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    in_stack_ffffffffffffffb4 = uVar1 + 9 & 0xfffffffe;
    local_44 = in_stack_ffffffffffffffb4 + local_44;
    if ((in_RDX != 0) && (in_RDX < local_44)) {
      return VP8_STATUS_BITSTREAM_ERROR;
    }
    if ((*local_38 == 0x20385056) || (*local_38 == 0x4c385056)) break;
    if (local_40 < in_stack_ffffffffffffffb4) {
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }
    if (*local_38 == 0x48504c41) {
      *in_RCX = local_38 + 2;
      *in_R8 = (ulong)uVar1;
    }
    local_38 = (int *)((long)local_38 + (ulong)in_stack_ffffffffffffffb4);
    local_40 = local_40 - in_stack_ffffffffffffffb4;
  }
  return VP8_STATUS_OK;
}

Assistant:

static VP8StatusCode ParseOptionalChunks(const uint8_t** const data,
                                         size_t* const data_size,
                                         size_t const riff_size,
                                         const uint8_t** const alpha_data,
                                         size_t* const alpha_size) {
  const uint8_t* buf;
  size_t buf_size;
  uint32_t total_size = TAG_SIZE +           // "WEBP".
                        CHUNK_HEADER_SIZE +  // "VP8Xnnnn".
                        VP8X_CHUNK_SIZE;     // data.
  assert(data != NULL);
  assert(data_size != NULL);
  buf = *data;
  buf_size = *data_size;

  assert(alpha_data != NULL);
  assert(alpha_size != NULL);
  *alpha_data = NULL;
  *alpha_size = 0;

  while (1) {
    uint32_t chunk_size;
    uint32_t disk_chunk_size;   // chunk_size with padding

    *data = buf;
    *data_size = buf_size;

    if (buf_size < CHUNK_HEADER_SIZE) {  // Insufficient data.
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }

    chunk_size = GetLE32(buf + TAG_SIZE);
    if (chunk_size > MAX_CHUNK_PAYLOAD) {
      return VP8_STATUS_BITSTREAM_ERROR;          // Not a valid chunk size.
    }
    // For odd-sized chunk-payload, there's one byte padding at the end.
    disk_chunk_size = (CHUNK_HEADER_SIZE + chunk_size + 1) & ~1u;
    total_size += disk_chunk_size;

    // Check that total bytes skipped so far does not exceed riff_size.
    if (riff_size > 0 && (total_size > riff_size)) {
      return VP8_STATUS_BITSTREAM_ERROR;          // Not a valid chunk size.
    }

    // Start of a (possibly incomplete) VP8/VP8L chunk implies that we have
    // parsed all the optional chunks.
    // Note: This check must occur before the check 'buf_size < disk_chunk_size'
    // below to allow incomplete VP8/VP8L chunks.
    if (!memcmp(buf, "VP8 ", TAG_SIZE) ||
        !memcmp(buf, "VP8L", TAG_SIZE)) {
      return VP8_STATUS_OK;
    }

    if (buf_size < disk_chunk_size) {             // Insufficient data.
      return VP8_STATUS_NOT_ENOUGH_DATA;
    }

    if (!memcmp(buf, "ALPH", TAG_SIZE)) {         // A valid ALPH header.
      *alpha_data = buf + CHUNK_HEADER_SIZE;
      *alpha_size = chunk_size;
    }

    // We have a full and valid chunk; skip it.
    buf += disk_chunk_size;
    buf_size -= disk_chunk_size;
  }
}